

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UChar32 utext_current32_63(UText *ut)

{
  int32_t iVar1;
  int64_t iVar2;
  UBool UVar3;
  UBool r;
  int32_t originalOffset;
  int64_t nativePosition;
  uint local_20;
  UChar32 supplementaryC;
  UChar32 trail;
  UChar32 c;
  UText *ut_local;
  
  if ((ut->chunkOffset == ut->chunkLength) &&
     (UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar3 == '\0')) {
    ut_local._4_4_ = 0xffffffff;
  }
  else {
    nativePosition._4_4_ = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
    ut_local._4_4_ = nativePosition._4_4_;
    if ((nativePosition._4_4_ & 0xfffffc00) == 0xd800) {
      local_20 = 0;
      if (ut->chunkOffset + 1 < ut->chunkLength) {
        local_20 = (uint)(ushort)ut->chunkContents[ut->chunkOffset + 1];
      }
      else {
        iVar2 = ut->chunkNativeLimit;
        iVar1 = ut->chunkOffset;
        UVar3 = (*ut->pFuncs->access)(ut,iVar2,'\x01');
        if (UVar3 != '\0') {
          local_20 = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
        }
        UVar3 = (*ut->pFuncs->access)(ut,iVar2,'\0');
        ut->chunkOffset = iVar1;
        if (UVar3 == '\0') {
          return -1;
        }
      }
      if ((local_20 & 0xfffffc00) == 0xdc00) {
        nativePosition._4_4_ = nativePosition._4_4_ * 0x400 + local_20 + 0xfca02400;
      }
      ut_local._4_4_ = nativePosition._4_4_;
    }
  }
  return ut_local._4_4_;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_current32(UText *ut) {
    UChar32  c;
    if (ut->chunkOffset==ut->chunkLength) {
        // Current position is just off the end of the chunk.
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // Off the end of the text.
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal, non-supplementary case.
        return c;
    }

    //
    //  Possible supplementary char.
    //
    UChar32   trail = 0;
    UChar32   supplementaryC = c;
    if ((ut->chunkOffset+1) < ut->chunkLength) {
        // The trail surrogate is in the same chunk.
        trail = ut->chunkContents[ut->chunkOffset+1];
    } else {
        //  The trail surrogate is in a different chunk.
        //     Because we must maintain the iteration position, we need to switch forward
        //     into the new chunk, get the trail surrogate, then revert the chunk back to the
        //     original one.
        //     An edge case to be careful of:  the entire text may end with an unpaired
        //        leading surrogate.  The attempt to access the trail will fail, but
        //        the original position before the unpaired lead still needs to be restored.
        int64_t  nativePosition = ut->chunkNativeLimit;
        int32_t  originalOffset = ut->chunkOffset;
        if (ut->pFuncs->access(ut, nativePosition, TRUE)) {
            trail = ut->chunkContents[ut->chunkOffset];
        }
        UBool r = ut->pFuncs->access(ut, nativePosition, FALSE);  // reverse iteration flag loads preceding chunk
        U_ASSERT(r==TRUE);
        ut->chunkOffset = originalOffset;
        if(!r) {
            return U_SENTINEL;
        }
    }

    if (U16_IS_TRAIL(trail)) {
        supplementaryC = U16_GET_SUPPLEMENTARY(c, trail);
    }
    return supplementaryC;

}